

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O1

void __thiscall Symbol::RestoreHasFuncAssignment(Symbol *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->hasFuncAssignment != (this->symbolType == STFunction)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0xaf,"(hasFuncAssignment == (this->symbolType == STFunction))",
                       "hasFuncAssignment == (this->symbolType == STFunction)");
    if (!bVar2) goto LAB_008b467d;
    *puVar3 = 0;
  }
  if ((this->symbolType != STFormal) && (this->hasMaybeEscapedUse == true)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0xb0,"(this->GetIsFormal() || !this->GetHasMaybeEscapedUse())",
                       "this->GetIsFormal() || !this->GetHasMaybeEscapedUse()");
    if (!bVar2) {
LAB_008b467d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->hasFuncAssignment = true;
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,StackFuncPhase);
  if (bVar2) {
    Output::Print(L"RestoreHasFuncAssignment: %s\n",(this->name).string.ptr);
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void Symbol::RestoreHasFuncAssignment()
{
    Assert(hasFuncAssignment == (this->symbolType == STFunction));
    Assert(this->GetIsFormal() || !this->GetHasMaybeEscapedUse());
    hasFuncAssignment = true;
    if (PHASE_TESTTRACE1(Js::StackFuncPhase))
    {
        Output::Print(_u("RestoreHasFuncAssignment: %s\n"), this->GetName().GetBuffer());
        Output::Flush();
    }
}